

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmIllegal<(moira::Instr)32,(moira::Mode)8,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  int iVar2;
  Int i;
  long lVar3;
  char cVar4;
  char *pcVar5;
  
  SVar1 = str->style->syntax;
  if (1 < SVar1 - GNU) {
    cVar4 = 'd';
    if (SVar1 == MUSASHI) {
      lVar3 = 1;
      do {
        pcVar5 = str->ptr;
        str->ptr = pcVar5 + 1;
        *pcVar5 = cVar4;
        cVar4 = "dc.w "[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 6);
      StrWriter::operator<<(str,(UInt16)op);
      cVar4 = ';';
      lVar3 = 1;
      do {
        pcVar5 = str->ptr;
        str->ptr = pcVar5 + 1;
        *pcVar5 = cVar4;
        cVar4 = "dc.w $%04x; ILLEGAL"[lVar3 + 10];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 10);
    }
    else {
      lVar3 = 1;
      do {
        pcVar5 = str->ptr;
        str->ptr = pcVar5 + 1;
        *pcVar5 = cVar4;
        cVar4 = "dc.w "[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 6);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar5 = str->ptr;
        str->ptr = pcVar5 + 1;
        *pcVar5 = ' ';
      }
      else {
        iVar2 = (str->tab).raw;
        pcVar5 = str->ptr;
        do {
          str->ptr = pcVar5 + 1;
          *pcVar5 = ' ';
          pcVar5 = str->ptr;
        } while (pcVar5 < str->base + iVar2);
      }
      StrWriter::operator<<(str,(UInt16)op);
      cVar4 = ';';
      lVar3 = 1;
      do {
        pcVar5 = str->ptr;
        str->ptr = pcVar5 + 1;
        *pcVar5 = cVar4;
        cVar4 = "dc.w $%04x; ILLEGAL"[lVar3 + 10];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 10);
    }
    return;
  }
  cVar4 = '.';
  lVar3 = 1;
  do {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = cVar4;
    cVar4 = ".short "[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  i.raw._2_2_ = 0;
  i.raw._0_2_ = op;
  StrWriter::operator<<(str,i);
  return;
}

Assistant:

void
Moira::dasmIllegal(StrWriter &str, u32 &addr, u16 op) const
{
    switch (str.style.syntax) {

       case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << ".short " << Int{op};
            break;

        case Syntax::MUSASHI:

            str << "dc.w " << UInt16{op} << "; ILLEGAL";
            break;

        default:

            str << "dc.w " << str.tab << UInt16{op} << "; ILLEGAL";
            break;
    }
}